

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void check_all_nodes_registered(EVmaster master)

{
  EVdfg_configuration p_Var1;
  char *in_RDI;
  CManager unaff_retaddr;
  EVint_node_list node;
  EVdfg dfg;
  int i;
  EVdfg in_stack_00000060;
  EVdfg in_stack_00000070;
  EVdfg_configuration in_stack_ffffffffffffffe0;
  long local_18;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  local_18 = *(long *)(in_RDI + 0x28);
  if (*(long *)(in_RDI + 8) == 0) {
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(int *)(in_RDI + 0x34);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      if ((*(int *)(*(long *)(in_RDI + 0x38) + (long)in_stack_fffffffffffffff4 * 0x38 + 0x28) == 0)
         && (*(long *)(*(long *)(in_RDI + 0x38) + (long)in_stack_fffffffffffffff4 * 0x38 + 0x20) ==
             0)) {
        return;
      }
    }
  }
  else {
    in_stack_ffffffffffffffe0 =
         (EVdfg_configuration)
         (*(long *)(in_RDI + 0x38) + (long)(*(int *)(in_RDI + 0x34) + -1) * 0x38);
    IntCManager_unlock(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4);
    (**(code **)(in_RDI + 8))(in_RDI,*(undefined8 *)in_stack_ffffffffffffffe0,0);
    IntCManager_lock(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4);
    local_18 = *(long *)(in_RDI + 0x28);
    if (local_18 == 0) {
      return;
    }
    if (*(int *)(local_18 + 0x20) == 0) {
      return;
    }
    if ((*(int *)(local_18 + 0x20) == 1) && (*(int *)(in_RDI + 0x50) == 1)) {
      return;
    }
  }
  if (*(int *)(in_RDI + 0x5c) == 0) {
    perform_deployment(in_stack_00000060);
    wait_for_deploy_acks((EVdfg)0x165a99);
  }
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  if (*(long *)(local_18 + 0x30) != 0) {
    free_dfg_state(in_stack_ffffffffffffffe0);
  }
  *(undefined8 *)(local_18 + 0x30) = *(undefined8 *)(local_18 + 0x38);
  p_Var1 = copy_dfg_state((EVdfg_configuration)
                          CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(EVdfg_configuration *)(local_18 + 0x38) = p_Var1;
  signal_ready(in_stack_00000070);
  *(undefined4 *)(local_18 + 0x14) = *(undefined4 *)(local_18 + 0x10);
  *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RDI + 0x34);
  return;
}

Assistant:

static void
check_all_nodes_registered(EVmaster master)
{
    int i;
    EVdfg dfg = master->dfg;
    if (master->node_join_handler != NULL) {
	EVint_node_list node = &master->nodes[master->node_count-1];
	CManager_unlock(master->cm);
	(master->node_join_handler)(master, node->name, NULL, NULL);
	CManager_lock(master->cm);
	dfg = master->dfg;
	if ((dfg == NULL) || (dfg->realized == 0) || 
	    (dfg->realized == 1 && master->reconfig == 1)) return;
    } else {
	/* must be static node list */
	for(i=0; i<master->node_count; i++) {
	    if (!master->nodes[i].self && (master->nodes[i].conn == NULL)) {
		return;
	    }
	}
    }
	
    if (master->no_deployment == 0) {
	perform_deployment(dfg);
	wait_for_deploy_acks(dfg);
    }
    master->no_deployment = 0;
    if (dfg->deployed_state) {
	free_dfg_state(dfg->deployed_state);
    }
    dfg->deployed_state = dfg->working_state;
    dfg->working_state = copy_dfg_state(dfg->deployed_state);
    
    signal_ready(dfg);
    dfg->deployed_stone_count = dfg->stone_count;
    master->old_node_count = master->node_count;
}